

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<kj::HttpClient::Response> __thiscall
kj::Promise<kj::HttpClient::Response>::
attach<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>>
          (Promise<kj::HttpClient::Response> *this,
          Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl> *attachments)

{
  Own<kj::_::PromiseNode> *params;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl> *params_00;
  NoInfer<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>_> *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<kj::HttpClient::Response> PVar1;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl> local_50;
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>_>_>
  local_40;
  Own<kj::_::PromiseNode> local_30;
  NoInfer<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>_> *local_20;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl> *attachments_local;
  Promise<kj::HttpClient::Response> *this_local;
  
  local_20 = in_RDX;
  attachments_local = attachments;
  this_local = this;
  params = mv<kj::Own<kj::_::PromiseNode>>((Own<kj::_::PromiseNode> *)attachments);
  params_00 = fwd<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>>(local_20);
  tuple<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>>
            ((kj *)&local_50,params_00);
  heap<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>>,kj::Own<kj::_::PromiseNode>,kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>>
            ((kj *)&local_40,params,&local_50);
  Own<kj::_::PromiseNode>::
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>>,void>
            (&local_30,&local_40);
  Promise(this,false,&local_30);
  Own<kj::_::PromiseNode>::~Own(&local_30);
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>_>_>
  ::~Own(&local_40);
  Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>::~Own(&local_50);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::HttpClient::Response>)PVar1.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false, kj::heap<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
      kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}